

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask20_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = in[1];
  uVar2 = in[3];
  auVar7._8_8_ = 0xc00000018;
  auVar7._0_8_ = 0xc00000018;
  *out = uVar1 << 0x14 | *in;
  out[1] = uVar2 << 0x1c | in[2] << 8 | uVar1 >> 0xc;
  uVar1 = in[4];
  uVar3 = in[0xb];
  out[2] = uVar1 << 0x10 | uVar2 >> 4;
  auVar6 = vpinsrd_avx(ZEXT416(in[5] << 4 | uVar1 >> 0x10),
                       (uint)(*(ulong *)(in + 6) >> 8) & 0xffffff,1);
  uVar1 = in[9];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in + 6);
  auVar5 = vpsllvd_avx2(auVar5,auVar7);
  auVar6 = vpor_avx(auVar5,auVar6);
  *(long *)(out + 3) = auVar6._0_8_;
  out[5] = uVar1 << 0x14 | in[8];
  out[6] = uVar3 << 0x1c | in[10] << 8 | uVar1 >> 0xc;
  uVar1 = in[0xc];
  uVar4 = in[0xd];
  out[7] = uVar1 << 0x10 | uVar3 >> 4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 0xe);
  auVar5 = vpsllvd_avx2(auVar6,auVar7);
  auVar6 = vpinsrd_avx(ZEXT416(uVar4 << 4 | uVar1 >> 0x10),
                       (uint)(*(ulong *)(in + 0xe) >> 8) & 0xffffff,1);
  auVar6 = vpor_avx(auVar5,auVar6);
  *(long *)(out + 8) = auVar6._0_8_;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask20_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;

  return out;
}